

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O3

double __thiscall nn::ESoinn::calcAvgDensity(ESoinn *this)

{
  pointer pEVar1;
  pointer pEVar2;
  ConcreteLogger *this_00;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  double *pdVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  string local_48;
  
  this_00 = log_netw;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"calcAvgDensity function","");
  logger::ConcreteLogger::debug(this_00,&local_48,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  pEVar1 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar3 = ((long)pEVar2 - (long)pEVar1 >> 3) * -0xf0f0f0f0f0f0f0f;
  uVar6 = 0;
  this->m_NumEmptyNeurons = 0;
  if (pEVar2 == pEVar1) {
    dVar10 = 0.0;
  }
  else {
    pdVar7 = &pEVar1->m_Density;
    dVar10 = 0.0;
    uVar8 = 1;
    do {
      if (*(bool *)(pdVar7 + -7) == true) {
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
        this->m_NumEmptyNeurons = uVar5;
      }
      else {
        dVar10 = dVar10 + *pdVar7;
      }
      uVar9 = (ulong)uVar8;
      pdVar7 = pdVar7 + 0x11;
      uVar8 = uVar8 + 1;
    } while (uVar9 <= uVar3 && uVar3 - uVar9 != 0);
  }
  lVar4 = uVar3 - uVar6;
  auVar11._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar11._0_8_ = lVar4;
  auVar11._12_4_ = 0x45300000;
  return dVar10 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
}

Assistant:

double ESoinn::calcAvgDensity()
    {
        log_netw->debug("calcAvgDensity function");
        m_NumEmptyNeurons = 0;
        double sumLocalSignals = 0;
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
            {
                m_NumEmptyNeurons++;
                continue;
            }
            sumLocalSignals += m_Neurons[i].density();
        }
        return sumLocalSignals / (double) (m_Neurons.size() - m_NumEmptyNeurons);
    }